

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O2

int __thiscall
QtMWidgets::NavigationArrowPrivate::init(NavigationArrowPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined8 uVar2;
  int iVar3;
  QPalette *this_00;
  QColor *pQVar4;
  QTimer *this_01;
  Object local_20 [8];
  
  this_00 = (QPalette *)QWidget::palette();
  pQVar4 = QPalette::color(this_00,Highlight);
  uVar2 = *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this->baseColor = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this->baseColor).ct + 2) = uVar2;
  uVar2 = *(undefined8 *)pQVar4;
  uVar1 = *(undefined4 *)((long)&pQVar4->ct + 4);
  (this->color).ct.argb.pad = (pQVar4->ct).argb.pad;
  *(undefined4 *)((long)&(this->color).ct + 4) = uVar1;
  *(undefined8 *)&this->color = uVar2;
  this_01 = (QTimer *)operator_new(0x10);
  QTimer::QTimer(this_01,(QObject *)this->q);
  this->timer = this_01;
  QObject::connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QtMWidgets::NavigationArrow::*)()>
            (local_20,(offset_in_QTimer_to_subr)this_01,(Object *)QTimer::timeout,0,
             (ConnectionType)this->q);
  QMetaObject::Connection::~Connection((Connection *)local_20);
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  QWidget::setBackgroundRole((ColorRole)this->q);
  iVar3 = QWidget::setAutoFillBackground(SUB81(this->q,0));
  return iVar3;
}

Assistant:

void init()
	{
		baseColor = q->palette().color( QPalette::Highlight );
		color = baseColor;
		timer = new QTimer( q );

		QObject::connect( timer, &QTimer::timeout,
			q, &NavigationArrow::_q_timer );

		q->setSizePolicy( QSizePolicy::Fixed, QSizePolicy::Fixed );

		q->setBackgroundRole( QPalette::Base );
		q->setAutoFillBackground( true );
	}